

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateConstructorCode
          (SingularStringView *this,Printer *p)

{
  LogMessageFatal local_20;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    if ((((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
         (string *)0x0) && ((this->super_FieldGeneratorBase).is_oneof_ == false)) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_generators/string_view_field.cc"
                 ,0x1dd,"!is_inlined()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
    }
  }
  else if ((this->super_FieldGeneratorBase).is_oneof_ == false) {
    io::Printer::Emit(p,0x1f,"\n    $field_$.InitDefault();\n  ");
    if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ ==
        (string *)0x0) {
      io::Printer::Emit(p,0x6b,
                        "\n      if ($pbi$::DebugHardenForceCopyDefaultString()) {\n        $field_$.Set(\"\", GetArena());\n      }\n    "
                       );
      return;
    }
  }
  return;
}

Assistant:

void SingularStringView::GenerateConstructorCode(io::Printer* p) const {
  if ((is_inlined() && EmptyDefault()) || is_oneof()) return;
  ABSL_DCHECK(!is_inlined());

  p->Emit(R"cc(
    $field_$.InitDefault();
  )cc");

  if (EmptyDefault()) {
    p->Emit(R"cc(
      if ($pbi$::DebugHardenForceCopyDefaultString()) {
        $field_$.Set("", GetArena());
      }
    )cc");
  }
}